

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catbtor.c
# Opt level: O3

int32_t main(int32_t argc,char **argv)

{
  char *pcVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  int iVar4;
  char *pcVar5;
  char *__filename;
  ulong uVar6;
  bool bVar7;
  undefined1 local_40 [16];
  
  bVar7 = true;
  __filename = input_name;
  if (1 < argc) {
    iVar4 = 0;
    uVar6 = 1;
    pcVar5 = input_name;
    do {
      __filename = argv[uVar6];
      if (*__filename == '-') {
        if ((__filename[1] == 'h') && (__filename[2] == '\0')) goto LAB_00101681;
        if ((__filename[1] != 'v') || (__filename[2] != '\0')) {
          main_cold_2();
LAB_00101677:
          main_cold_1();
          goto LAB_0010167c;
        }
        iVar4 = iVar4 + 1;
        __filename = pcVar5;
        pcVar1 = input_name;
      }
      else {
        pcVar1 = __filename;
        if (pcVar5 != (char *)0x0) goto LAB_00101677;
      }
      input_name = pcVar1;
      uVar6 = uVar6 + 1;
      pcVar5 = __filename;
    } while ((uint)argc != uVar6);
    bVar7 = iVar4 == 0;
  }
  if (__filename == (char *)0x0) {
    input_file = _stdin;
    input_name = "<stdin>";
  }
  else {
    input_file = (FILE *)fopen(__filename,"r");
    if ((FILE *)input_file == (FILE *)0x0) goto LAB_0010168e;
    close_input = '\x01';
  }
  if (!bVar7) {
    main_cold_4();
  }
  uVar2 = btor2parser_new();
  iVar4 = btor2parser_read_lines(uVar2,input_file);
  if (iVar4 != 0) {
    if (close_input == '\x01') {
      fclose((FILE *)input_file);
    }
    if (!bVar7) {
      main_cold_5();
    }
    local_40 = btor2parser_iter_init(uVar2);
    puVar3 = (undefined8 *)btor2parser_iter_next();
    if (puVar3 != (undefined8 *)0x0) {
      do {
        printf("%ld %s",*puVar3,puVar3[2]);
        if (*(int *)(puVar3 + 3) == 0x2d) {
          printf(" %s",puVar3[6]);
          if (*(int *)(puVar3 + 5) == 0) {
            printf(" %ld %ld",puVar3[7],puVar3[8]);
          }
          else {
            if (*(int *)(puVar3 + 5) != 1) goto LAB_0010167c;
            printf(" %u",(ulong)*(uint *)(puVar3 + 7));
          }
        }
        else if (puVar3[4] != 0) {
          printf(" %ld");
        }
        if (*(int *)(puVar3 + 0xd) != 0) {
          uVar6 = 0;
          do {
            printf(" %ld",*(undefined8 *)(puVar3[0xe] + uVar6 * 8));
            uVar6 = uVar6 + 1;
          } while (uVar6 < *(uint *)(puVar3 + 0xd));
        }
        iVar4 = *(int *)(puVar3 + 3);
        if (iVar4 == 0x29) {
          printf(" %ld %ld",*(undefined8 *)(puVar3[0xe] + 8),*(undefined8 *)(puVar3[0xe] + 0x10));
          iVar4 = *(int *)(puVar3 + 3);
        }
        if ((iVar4 == 0x38) || (iVar4 == 0x26)) {
          printf(" %ld",*(undefined8 *)(puVar3[0xe] + 8));
        }
        if (puVar3[0xb] != 0) {
          printf(" %s");
        }
        if (puVar3[0xc] != 0) {
          printf(" %s");
        }
        fputc(10,_stdout);
        puVar3 = (undefined8 *)btor2parser_iter_next(local_40);
      } while (puVar3 != (undefined8 *)0x0);
    }
    btor2parser_delete(uVar2);
    if (!bVar7) {
      main_cold_7();
    }
    return 0;
  }
LAB_00101686:
  main_cold_8();
LAB_0010168e:
  main_cold_3();
  halt_baddata();
LAB_0010167c:
  main_cold_6();
LAB_00101681:
  main_cold_9();
  goto LAB_00101686;
}

Assistant:

int32_t
main (int32_t argc, char** argv)
{
  Btor2Parser* reader;
  Btor2LineIterator it;
  Btor2Line* l;
  uint32_t j;
  int32_t i, verbosity = 0;
  const char* err;
  for (i = 1; i < argc; i++)
  {
    if (!strcmp (argv[i], "-h"))
    {
      fprintf (stderr, "usage: catbtor [-h|-v] [ <btorfile> ]\n");
      exit (1);
    }
    else if (!strcmp (argv[i], "-v"))
      verbosity++;
    else if (argv[i][0] == '-')
    {
      fprintf (
          stderr, "*** catbtor: invalid option '%s' (try '-h')\n", argv[i]);
      exit (1);
    }
    else if (input_name)
    {
      fprintf (stderr, "*** catbtor: too many inputs (try '-h')\n");
      exit (1);
    }
    else
      input_name = argv[i];
  }
  if (!input_name)
  {
    input_file = stdin;
    assert (!close_input);
    input_name = "<stdin>";
  }
  else
  {
    input_file = fopen (input_name, "r");
    if (!input_file)
    {
      fprintf (
          stderr, "*** catbtor: can not open '%s' for reading\n", input_name);
      exit (1);
    }
    close_input = 1;
  }
  if (verbosity)
  {
    fprintf (stderr,
             "; [catbor] simple CAT for BTOR files\n"
             "; [catbor] reading '%s'\n",
             input_name);
    fflush (stderr);
  }
  reader = btor2parser_new ();
  if (!btor2parser_read_lines (reader, input_file))
  {
    err = btor2parser_error (reader);
    assert (err);
    fprintf (stderr, "*** catbtor: parse error in '%s' %s\n", input_name, err);
    btor2parser_delete (reader);
    if (close_input) fclose (input_file);
    exit (1);
  }
  if (close_input) fclose (input_file);
  if (verbosity)
  {
    fprintf (stderr, "; [catbor] finished parsing '%s'\n", input_name);
    fflush (stderr);
  }
  if (verbosity)
  {
    fprintf (stderr, "; [catbor] starting to dump BTOR model to '<stdout>'\n");
    fflush (stderr);
  }
  it = btor2parser_iter_init (reader);
  while ((l = btor2parser_iter_next (&it)))
  {
    printf ("%" PRId64 " %s", l->id, l->name);
    if (l->tag == BTOR2_TAG_sort)
    {
      printf (" %s", l->sort.name);
      switch (l->sort.tag)
      {
        case BTOR2_TAG_SORT_bitvec: printf (" %u", l->sort.bitvec.width); break;
        case BTOR2_TAG_SORT_array:
          printf (" %" PRId64 " %" PRId64, l->sort.array.index, l->sort.array.element);
          break;
        default:
          assert (0);
          fprintf (stderr, "*** catbtor: invalid sort encountered\n");
          exit (1);
      }
    }
    else if (l->sort.id)
      printf (" %" PRId64, l->sort.id);
    for (j = 0; j < l->nargs; j++) printf (" %" PRId64, l->args[j]);
    if (l->tag == BTOR2_TAG_slice) printf (" %" PRId64 " %" PRId64, l->args[1], l->args[2]);
    if (l->tag == BTOR2_TAG_sext || l->tag == BTOR2_TAG_uext)
      printf (" %" PRId64, l->args[1]);
    if (l->constant) printf (" %s", l->constant);
    if (l->symbol) printf (" %s", l->symbol);
    fputc ('\n', stdout);
  }
  btor2parser_delete (reader);
  if (verbosity)
  {
    fprintf (stderr, "; [catbor] finished dumping BTOR model to '<stdout>'\n");
    fflush (stderr);
  }
  return 0;
}